

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

int Gia_ManLevelNum(Gia_Man_t *p)

{
  int iVar1;
  ulong uVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *pVVar4;
  ulong uVar5;
  int extraout_EDX;
  int extraout_EDX_00;
  uint uVar6;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int iVar7;
  ulong extraout_RDX;
  ulong uVar8;
  long lVar9;
  long lVar10;
  Gia_Obj_t *pObj;
  
  Gia_ManCleanLevels(p,p->nObjs);
  p->nLevels = 0;
  iVar7 = 0;
  if ((0 < p->nObjs) && (pObj = p->pObjs, pObj != (Gia_Obj_t *)0x0)) {
    lVar10 = 1;
    lVar9 = 0;
    uVar8 = extraout_RDX;
    do {
      uVar2 = *(ulong *)pObj;
      if (p->fGiaSimple == 0) {
        uVar8 = 0x80000000;
        uVar5 = uVar2 & 0x80000000;
        if (uVar5 != 0) goto LAB_0023e970;
        uVar6 = (uint)uVar2 & 0x1fffffff;
        uVar8 = (ulong)uVar6;
        if ((uVar6 == 0x1fffffff) || (uVar6 != ((uint)(uVar2 >> 0x20) & 0x1fffffff)))
        goto LAB_0023e970;
        Gia_ObjSetBufLevel(p,pObj);
        iVar7 = extraout_EDX_01;
      }
      else {
        uVar5 = (ulong)((uint)uVar2 & 0x80000000);
LAB_0023e970:
        if ((uVar2 & 0x1fffffff) == 0x1fffffff || uVar5 != 0) {
          if (uVar5 == 0 || (int)(uVar2 & 0x1fffffff) == 0x1fffffff) {
            pVVar4 = p->vLevels;
            Vec_IntFillExtra(pVVar4,(int)lVar10,(int)CONCAT71((int7)(uVar8 >> 8),uVar5 != 0));
            if ((long)pVVar4->nSize <= lVar10 + -1) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            pVVar4->pArray[lVar10 + -1] = 0;
            iVar7 = extraout_EDX_02;
          }
          else {
            Gia_ObjSetCoLevel(p,pObj);
            iVar7 = extraout_EDX_00;
          }
        }
        else {
          Gia_ObjSetGateLevel(p,pObj);
          iVar7 = extraout_EDX;
        }
      }
      pGVar3 = p->pObjs;
      if ((pObj < pGVar3) || (pGVar3 + p->nObjs <= pObj)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar1 = p->nLevels;
      uVar6 = (int)((long)pObj - (long)pGVar3 >> 2) * -0x55555555;
      pVVar4 = p->vLevels;
      Vec_IntFillExtra(pVVar4,uVar6 + 1,iVar7);
      if (((int)uVar6 < 0) || (pVVar4->nSize <= (int)uVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar7 = pVVar4->pArray[uVar6 & 0x7fffffff];
      if (pVVar4->pArray[uVar6 & 0x7fffffff] < iVar1) {
        iVar7 = iVar1;
      }
      p->nLevels = iVar7;
      if (p->nObjs <= lVar10) {
        return iVar7;
      }
      lVar9 = lVar9 + 1;
      uVar8 = lVar9 * 3;
      pObj = p->pObjs + lVar9;
      lVar10 = lVar10 + 1;
    } while (p->pObjs != (Gia_Obj_t *)0x0);
  }
  return iVar7;
}

Assistant:

int Gia_ManLevelNum( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManCleanLevels( p, Gia_ManObjNum(p) );
    p->nLevels = 0;
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( !p->fGiaSimple && Gia_ObjIsBuf(pObj) )
            Gia_ObjSetBufLevel( p, pObj );
        else if ( Gia_ObjIsAnd(pObj) )
            Gia_ObjSetGateLevel( p, pObj );
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjSetCoLevel( p, pObj );
        else
            Gia_ObjSetLevel( p, pObj, 0 );
        p->nLevels = Abc_MaxInt( p->nLevels, Gia_ObjLevel(p, pObj) );
    }
    return p->nLevels;
}